

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_atomics_notify(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv)

{
  list_head *plVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  JSValueUnion JVar5;
  list_head *plVar6;
  int64_t iVar7;
  JSValue JVar8;
  JSValue val;
  int32_t count;
  JSArrayBuffer *abuf;
  list_head waiter_list;
  int local_4c;
  JSArrayBuffer *local_48;
  list_head local_40;
  
  JVar5.float64 = 0.0;
  plVar3 = (list_head *)
           js_atomics_get_ptr(ctx,&local_48,(int *)0x0,(JSClassID *)0x0,*argv,argv[1],1);
  iVar7 = 6;
  if (plVar3 != (list_head *)0x0) {
    if ((int)argv[2].tag == 3) {
      local_4c = 0x7fffffff;
    }
    else {
      JVar5.float64 = 0.0;
      val.tag = argv[2].tag;
      val.u.ptr = argv[2].u.ptr;
      iVar2 = JS_ToInt32Clamp(ctx,&local_4c,val,0,0x7fffffff,0);
      if (iVar2 != 0) goto LAB_00169b28;
    }
    iVar2 = local_4c;
    if (local_48->detached == '\0') {
      JVar5.float64 = 0.0;
      if (0 < local_4c && local_48->shared != '\0') {
        pthread_mutex_lock((pthread_mutex_t *)&js_atomics_mutex);
        local_40.prev = &local_40;
        local_40.next = &local_40;
        if (js_atomics_waiter_list.next != &js_atomics_waiter_list) {
          JVar5.float64 = 0.0;
          plVar4 = js_atomics_waiter_list.next;
          do {
            plVar1 = plVar4->next;
            if (plVar4[4].next == plVar3) {
              plVar6 = plVar4->prev;
              plVar6->next = plVar1;
              plVar1->prev = plVar6;
              plVar4->prev = (list_head *)0x0;
              plVar4->next = (list_head *)0x0;
              *(undefined4 *)&plVar4[1].prev = 0;
              (local_40.prev)->next = plVar4;
              plVar4->prev = local_40.prev;
              plVar4->next = &local_40;
              JVar5._0_4_ = JVar5.int32 + 1;
              JVar5._4_4_ = 0;
              plVar6 = local_40.next;
              local_40.prev = plVar4;
              if (iVar2 <= (int)JVar5._0_4_) break;
            }
            plVar4 = plVar1;
            plVar6 = local_40.next;
          } while (plVar1 != &js_atomics_waiter_list);
          for (; plVar6 != &local_40; plVar6 = plVar6->next) {
            pthread_cond_signal((pthread_cond_t *)&plVar6[1].next);
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&js_atomics_mutex);
      }
      iVar7 = 0;
    }
    else {
      JVar5.float64 = 0.0;
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
    }
  }
LAB_00169b28:
  JVar8.tag = iVar7;
  JVar8.u.float64 = JVar5.float64;
  return JVar8;
}

Assistant:

static JSValue js_atomics_notify(JSContext *ctx,
                                 JSValueConst this_obj,
                                 int argc, JSValueConst *argv)
{
    struct list_head *el, *el1, waiter_list;
    int32_t count, n;
    void *ptr;
    JSAtomicsWaiter *waiter;
    JSArrayBuffer *abuf;

    ptr = js_atomics_get_ptr(ctx, &abuf, NULL, NULL, argv[0], argv[1], 1);
    if (!ptr)
        return JS_EXCEPTION;

    if (JS_IsUndefined(argv[2])) {
        count = INT32_MAX;
    } else {
        if (JS_ToInt32Clamp(ctx, &count, argv[2], 0, INT32_MAX, 0))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);

    n = 0;
    if (abuf->shared && count > 0) {
        pthread_mutex_lock(&js_atomics_mutex);
        init_list_head(&waiter_list);
        list_for_each_safe(el, el1, &js_atomics_waiter_list) {
            waiter = list_entry(el, JSAtomicsWaiter, link);
            if (waiter->ptr == ptr) {
                list_del(&waiter->link);
                waiter->linked = FALSE;
                list_add_tail(&waiter->link, &waiter_list);
                n++;
                if (n >= count)
                    break;
            }
        }
        list_for_each(el, &waiter_list) {
            waiter = list_entry(el, JSAtomicsWaiter, link);
            pthread_cond_signal(&waiter->cond);
        }
        pthread_mutex_unlock(&js_atomics_mutex);
    }
    return JS_NewInt32(ctx, n);
}